

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx2::BVHNIntersector1<4,_16781328,_false,_embree::avx2::VirtualCurveIntersector1>::
     intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 (*pauVar13) [16];
  undefined1 (*pauVar14) [16];
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  vint4 bi_2;
  undefined1 auVar24 [16];
  undefined1 auVar25 [64];
  float fVar26;
  vint4 bi_4;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined4 uVar33;
  vint4 ai_1;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  vint4 ai_3;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  vint4 ai;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  vfloat4 a0;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  vint4 ai_7;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  vint4 ai_4;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [64];
  undefined1 auVar55 [16];
  undefined1 auVar56 [64];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [16];
  undefined1 auVar62 [64];
  undefined1 auVar63 [16];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  vfloat<4> tNear;
  vint4 bi;
  Precalculations pre;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1148 [16];
  ulong local_1138;
  RayHit *local_1130;
  Intersectors *local_1128;
  RayQueryContext *local_1120;
  undefined1 local_1118 [16];
  undefined1 local_1108 [16];
  undefined1 local_10f8 [16];
  undefined1 local_10e8 [16];
  undefined1 local_10d8 [16];
  undefined1 local_10c8 [16];
  undefined1 local_10b8 [16];
  undefined4 local_10a8;
  undefined4 uStack_10a4;
  undefined4 uStack_10a0;
  undefined4 uStack_109c;
  undefined4 local_1098;
  undefined4 uStack_1094;
  undefined4 uStack_1090;
  undefined4 uStack_108c;
  undefined4 local_1088;
  undefined4 uStack_1084;
  undefined4 uStack_1080;
  undefined4 uStack_107c;
  undefined1 local_1078 [16];
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  undefined4 local_1058;
  undefined4 uStack_1054;
  undefined4 uStack_1050;
  undefined4 uStack_104c;
  undefined4 local_1048;
  undefined4 uStack_1044;
  undefined4 uStack_1040;
  undefined4 uStack_103c;
  undefined8 local_1038;
  undefined8 uStack_1030;
  undefined1 local_1028 [16];
  undefined1 local_1018 [16];
  undefined1 local_1008 [16];
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  undefined1 local_fc8 [16];
  float local_fb8 [4];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined1 local_f88 [16];
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_1120 = context;
  local_1128 = This;
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 != 8) {
    aVar1 = (ray->super_RayK<1>).dir.field_0.field_1;
    auVar28 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
    auVar34 = vrsqrtss_avx(auVar28,auVar28);
    fVar26 = auVar34._0_4_;
    local_fb8[0] = fVar26 * 1.5 - auVar28._0_4_ * 0.5 * fVar26 * fVar26 * fVar26;
    local_1048 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
    uStack_1044 = local_1048;
    uStack_1040 = local_1048;
    uStack_103c = local_1048;
    auVar44._0_4_ = aVar1.x * local_fb8[0];
    auVar44._4_4_ = aVar1.y * local_fb8[0];
    auVar44._8_4_ = aVar1.z * local_fb8[0];
    auVar44._12_4_ = aVar1.field_3.w * local_fb8[0];
    auVar34 = vshufpd_avx(auVar44,auVar44,1);
    auVar24._8_4_ = 0x80000000;
    auVar24._0_8_ = 0x8000000080000000;
    auVar24._12_4_ = 0x80000000;
    auVar28 = vmovshdup_avx(auVar44);
    auVar55._0_4_ = auVar28._0_4_ ^ 0x80000000;
    auVar48 = ZEXT816(0) << 0x40;
    auVar28 = vunpckhps_avx(auVar44,auVar48);
    auVar55._4_12_ = ZEXT812(0) << 0x20;
    auVar47 = vshufps_avx(auVar28,auVar55,0x41);
    auVar50._0_8_ = auVar34._0_8_ ^ 0x8000000080000000;
    auVar50._8_8_ = auVar34._8_8_ ^ auVar24._8_8_;
    auVar24 = vinsertps_avx(auVar50,auVar44,0x2a);
    auVar28 = vdpps_avx(auVar47,auVar47,0x7f);
    auVar34 = vdpps_avx(auVar24,auVar24,0x7f);
    auVar28 = vcmpps_avx(auVar34,auVar28,1);
    auVar57._0_4_ = auVar28._0_4_;
    auVar57._4_4_ = auVar57._0_4_;
    auVar57._8_4_ = auVar57._0_4_;
    auVar57._12_4_ = auVar57._0_4_;
    auVar28 = vblendvps_avx(auVar24,auVar47,auVar57);
    auVar34 = vdpps_avx(auVar28,auVar28,0x7f);
    local_1058 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
    uStack_1054 = local_1058;
    uStack_1050 = local_1058;
    uStack_104c = local_1058;
    local_1068 = (ray->super_RayK<1>).dir.field_0.m128[2];
    fStack_1064 = local_1068;
    fStack_1060 = local_1068;
    fStack_105c = local_1068;
    auVar24 = vrsqrtss_avx(auVar34,auVar34);
    fVar26 = auVar24._0_4_;
    fVar26 = fVar26 * 1.5 - auVar34._0_4_ * 0.5 * fVar26 * fVar26 * fVar26;
    auVar51._0_4_ = fVar26 * auVar28._0_4_;
    auVar51._4_4_ = fVar26 * auVar28._4_4_;
    auVar51._8_4_ = fVar26 * auVar28._8_4_;
    auVar51._12_4_ = fVar26 * auVar28._12_4_;
    auVar28 = vshufps_avx(auVar51,auVar51,0xc9);
    auVar34 = vshufps_avx(auVar44,auVar44,0xc9);
    auVar58._0_4_ = auVar34._0_4_ * auVar51._0_4_;
    auVar58._4_4_ = auVar34._4_4_ * auVar51._4_4_;
    auVar58._8_4_ = auVar34._8_4_ * auVar51._8_4_;
    auVar58._12_4_ = auVar34._12_4_ * auVar51._12_4_;
    auVar28 = vfmsub231ps_fma(auVar58,auVar44,auVar28);
    auVar24 = vshufps_avx(auVar28,auVar28,0xc9);
    auVar28 = vdpps_avx(auVar24,auVar24,0x7f);
    auVar34 = vrsqrtss_avx(auVar28,auVar28);
    fVar26 = auVar34._0_4_;
    fVar26 = fVar26 * 1.5 - auVar28._0_4_ * 0.5 * fVar26 * fVar26 * fVar26;
    auVar34._0_4_ = auVar24._0_4_ * fVar26;
    auVar34._4_4_ = auVar24._4_4_ * fVar26;
    auVar34._8_4_ = auVar24._8_4_ * fVar26;
    auVar34._12_4_ = auVar24._12_4_ * fVar26;
    auVar28._0_4_ = local_fb8[0] * auVar44._0_4_;
    auVar28._4_4_ = local_fb8[0] * auVar44._4_4_;
    auVar28._8_4_ = local_fb8[0] * auVar44._8_4_;
    auVar28._12_4_ = local_fb8[0] * auVar44._12_4_;
    auVar24 = vunpcklps_avx(auVar51,auVar28);
    auVar28 = vunpckhps_avx(auVar51,auVar28);
    auVar47 = vunpcklps_avx(auVar34,auVar48);
    auVar34 = vunpckhps_avx(auVar34,auVar48);
    local_f88 = vunpcklps_avx(auVar28,auVar34);
    local_fa8 = vunpcklps_avx(auVar24,auVar47);
    local_f98 = vunpckhps_avx(auVar24,auVar47);
    pauVar14 = (undefined1 (*) [16])local_f68;
    auVar34 = vmaxss_avx(ZEXT816(0) << 0x20,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    auVar24 = vmaxss_avx(ZEXT816(0) << 0x20,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    local_1078._8_4_ = 0x7fffffff;
    local_1078._0_8_ = 0x7fffffff7fffffff;
    local_1078._12_4_ = 0x7fffffff;
    auVar28 = vandps_avx((undefined1  [16])aVar1,local_1078);
    auVar47._8_4_ = 0x219392ef;
    auVar47._0_8_ = 0x219392ef219392ef;
    auVar47._12_4_ = 0x219392ef;
    auVar28 = vcmpps_avx(auVar28,auVar47,1);
    auVar28 = vblendvps_avx((undefined1  [16])aVar1,auVar47,auVar28);
    uStack_f70 = 0;
    auVar47 = vrcpps_avx(auVar28);
    auVar48._8_4_ = 0x3f800000;
    auVar48._0_8_ = 0x3f8000003f800000;
    auVar48._12_4_ = 0x3f800000;
    auVar28 = vfnmadd213ps_fma(auVar28,auVar47,auVar48);
    auVar48 = vfmadd132ps_fma(auVar28,auVar47,auVar47);
    fVar26 = auVar48._0_4_;
    local_1088 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    uStack_1084 = local_1088;
    uStack_1080 = local_1088;
    uStack_107c = local_1088;
    auVar28 = vmovshdup_avx(auVar48);
    auVar47 = vshufpd_avx(auVar48,auVar48,1);
    auVar52._0_4_ = fVar26 * (ray->super_RayK<1>).org.field_0.m128[0];
    auVar52._4_4_ = auVar48._4_4_ * (ray->super_RayK<1>).org.field_0.m128[1];
    auVar52._8_4_ = auVar48._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2];
    auVar52._12_4_ = auVar48._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3];
    uVar20 = (ulong)(fVar26 < 0.0) << 4;
    uVar23 = (ulong)(auVar28._0_4_ < 0.0) << 4 | 0x20;
    local_10b8._4_4_ = fVar26;
    local_10b8._0_4_ = fVar26;
    local_10b8._8_4_ = fVar26;
    local_10b8._12_4_ = fVar26;
    auVar56 = ZEXT1664(local_10b8);
    auVar28 = vshufps_avx(auVar52,auVar52,0x55);
    auVar44 = vshufps_avx(auVar52,auVar52,0xaa);
    uVar21 = CONCAT44(auVar52._0_4_,auVar52._0_4_);
    local_10c8._0_8_ = uVar21 ^ 0x8000000080000000;
    local_10c8._8_4_ = -auVar52._0_4_;
    local_10c8._12_4_ = -auVar52._0_4_;
    auVar54 = ZEXT1664(local_10c8);
    local_10d8._0_8_ = auVar28._0_8_ ^ 0x8000000080000000;
    local_10d8._8_4_ = auVar28._8_4_ ^ 0x80000000;
    local_10d8._12_4_ = auVar28._12_4_ ^ 0x80000000;
    auVar59 = ZEXT1664(local_10d8);
    local_10e8._0_8_ = auVar44._0_8_ ^ 0x8000000080000000;
    local_10e8._8_4_ = auVar44._8_4_ ^ 0x80000000;
    local_10e8._12_4_ = auVar44._12_4_ ^ 0x80000000;
    auVar60 = ZEXT1664(local_10e8);
    local_10f8 = vshufps_avx(auVar48,auVar48,0x55);
    auVar62 = ZEXT1664(local_10f8);
    local_1108 = vshufps_avx(auVar48,auVar48,0xaa);
    auVar64 = ZEXT1664(local_1108);
    uVar22 = (ulong)(auVar47._0_4_ < 0.0) << 4 | 0x40;
    uVar21 = uVar20 ^ 0x10;
    uVar33 = auVar34._0_4_;
    local_1118._4_4_ = uVar33;
    local_1118._0_4_ = uVar33;
    local_1118._8_4_ = uVar33;
    local_1118._12_4_ = uVar33;
    auVar65 = ZEXT1664(local_1118);
    uVar33 = auVar24._0_4_;
    auVar25 = ZEXT1664(CONCAT412(uVar33,CONCAT48(uVar33,CONCAT44(uVar33,uVar33))));
    local_1098 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
    uStack_1094 = local_1098;
    uStack_1090 = local_1098;
    uStack_108c = local_1098;
    local_10a8 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
    uStack_10a4 = local_10a8;
    uStack_10a0 = local_10a8;
    uStack_109c = local_10a8;
    local_1130 = ray;
    local_1138 = uVar20;
    do {
      pauVar13 = pauVar14 + -1;
      pauVar14 = pauVar14 + -1;
      if (*(float *)(*pauVar13 + 8) <= (ray->super_RayK<1>).tfar) {
        uVar15 = *(ulong *)*pauVar14;
        while ((uVar15 & 8) == 0) {
          fVar26 = (ray->super_RayK<1>).dir.field_0.m128[3];
          uVar17 = (uint)uVar15 & 7;
          uVar16 = uVar15 & 0xfffffffffffffff0;
          if (uVar17 == 3) {
            local_1018 = *(undefined1 (*) [16])(uVar16 + 0x20);
            local_1028 = *(undefined1 (*) [16])(uVar16 + 0x50);
            local_1008 = *(undefined1 (*) [16])(uVar16 + 0x60);
            auVar58 = *(undefined1 (*) [16])(uVar16 + 0x70);
            local_1038 = *(undefined8 *)*(undefined1 (*) [16])(uVar16 + 0x70);
            uStack_1030 = *(undefined8 *)(uVar16 + 0x78);
            auVar28 = *(undefined1 (*) [16])(uVar16 + 0x80);
            auVar34 = *(undefined1 (*) [16])(uVar16 + 0x90);
            fStack_fcc = 1.0 - fVar26;
            auVar61._0_4_ = fVar26 * *(float *)(uVar16 + 0xe0);
            auVar61._4_4_ = fVar26 * *(float *)(uVar16 + 0xe4);
            auVar61._8_4_ = fVar26 * *(float *)(uVar16 + 0xe8);
            auVar61._12_4_ = fVar26 * *(float *)(uVar16 + 0xec);
            auVar63._0_4_ = fVar26 * *(float *)(uVar16 + 0xf0);
            auVar63._4_4_ = fVar26 * *(float *)(uVar16 + 0xf4);
            auVar63._8_4_ = fVar26 * *(float *)(uVar16 + 0xf8);
            auVar63._12_4_ = fVar26 * *(float *)(uVar16 + 0xfc);
            auVar38._0_4_ = fVar26 * *(float *)(uVar16 + 0x100);
            auVar38._4_4_ = fVar26 * *(float *)(uVar16 + 0x104);
            auVar38._8_4_ = fVar26 * *(float *)(uVar16 + 0x108);
            auVar38._12_4_ = fVar26 * *(float *)(uVar16 + 0x10c);
            auVar29._4_4_ = fStack_fcc;
            auVar29._0_4_ = fStack_fcc;
            auVar29._8_4_ = fStack_fcc;
            auVar29._12_4_ = fStack_fcc;
            auVar24 = ZEXT816(0) << 0x40;
            auVar55 = vfmadd231ps_fma(auVar61,auVar29,auVar24);
            auVar57 = vfmadd231ps_fma(auVar63,auVar29,auVar24);
            local_fc8 = vfmadd231ps_fma(auVar38,auVar29,auVar24);
            local_ff8 = fStack_fcc + fVar26 * *(float *)(uVar16 + 0x110);
            fStack_ff4 = fStack_fcc + fVar26 * *(float *)(uVar16 + 0x114);
            fStack_ff0 = fStack_fcc + fVar26 * *(float *)(uVar16 + 0x118);
            fStack_fec = fStack_fcc + fVar26 * *(float *)(uVar16 + 0x11c);
            local_fe8 = fVar26 * *(float *)(uVar16 + 0x120) + fStack_fcc;
            fStack_fe4 = fVar26 * *(float *)(uVar16 + 0x124) + fStack_fcc;
            fStack_fe0 = fVar26 * *(float *)(uVar16 + 0x128) + fStack_fcc;
            fStack_fdc = fVar26 * *(float *)(uVar16 + 300) + fStack_fcc;
            local_fd8 = fStack_fcc + fVar26 * *(float *)(uVar16 + 0x130);
            fStack_fd4 = fStack_fcc + fVar26 * *(float *)(uVar16 + 0x134);
            fStack_fd0 = fStack_fcc + fVar26 * *(float *)(uVar16 + 0x138);
            fStack_fcc = fStack_fcc + fVar26 * *(float *)(uVar16 + 0x13c);
            auVar30._0_4_ = local_1068 * auVar28._0_4_;
            auVar30._4_4_ = fStack_1064 * auVar28._4_4_;
            auVar30._8_4_ = fStack_1060 * auVar28._8_4_;
            auVar30._12_4_ = fStack_105c * auVar28._12_4_;
            auVar35._0_4_ = local_1068 * auVar34._0_4_;
            auVar35._4_4_ = fStack_1064 * auVar34._4_4_;
            auVar35._8_4_ = fStack_1060 * auVar34._8_4_;
            auVar35._12_4_ = fStack_105c * auVar34._12_4_;
            auVar8._4_4_ = uStack_1054;
            auVar8._0_4_ = local_1058;
            auVar8._8_4_ = uStack_1050;
            auVar8._12_4_ = uStack_104c;
            auVar24 = vfmadd231ps_fma(auVar30,auVar8,local_1028);
            auVar47 = vfmadd231ps_fma(auVar35,auVar8,local_1008);
            auVar9._4_4_ = uStack_1044;
            auVar9._0_4_ = local_1048;
            auVar9._8_4_ = uStack_1040;
            auVar9._12_4_ = uStack_103c;
            auVar44 = vfmadd231ps_fma(auVar24,auVar9,local_1018);
            auVar47 = vfmadd231ps_fma(auVar47,auVar9,*(undefined1 (*) [16])(uVar16 + 0x30));
            auVar24 = vandps_avx(auVar44,local_1078);
            auVar42._8_4_ = 0x219392ef;
            auVar42._0_8_ = 0x219392ef219392ef;
            auVar42._12_4_ = 0x219392ef;
            auVar24 = vcmpps_avx(auVar24,auVar42,1);
            auVar44 = vblendvps_avx(auVar44,auVar42,auVar24);
            auVar24 = vandps_avx(auVar47,local_1078);
            auVar24 = vcmpps_avx(auVar24,auVar42,1);
            auVar48 = vblendvps_avx(auVar47,auVar42,auVar24);
            auVar24 = *(undefined1 (*) [16])(uVar16 + 0xa0);
            auVar36._0_4_ = local_1068 * auVar24._0_4_;
            auVar36._4_4_ = fStack_1064 * auVar24._4_4_;
            auVar36._8_4_ = fStack_1060 * auVar24._8_4_;
            auVar36._12_4_ = fStack_105c * auVar24._12_4_;
            auVar47 = vfmadd231ps_fma(auVar36,auVar8,auVar58);
            auVar50 = vfmadd231ps_fma(auVar47,auVar9,*(undefined1 (*) [16])(uVar16 + 0x40));
            auVar47 = vandps_avx(auVar50,local_1078);
            auVar47 = vcmpps_avx(auVar47,auVar42,1);
            auVar47 = vblendvps_avx(auVar50,auVar42,auVar47);
            auVar50 = vrcpps_avx(auVar44);
            auVar39._8_4_ = 0x3f800000;
            auVar39._0_8_ = 0x3f8000003f800000;
            auVar39._12_4_ = 0x3f800000;
            auVar44 = vfnmadd213ps_fma(auVar44,auVar50,auVar39);
            auVar50 = vfmadd132ps_fma(auVar44,auVar50,auVar50);
            auVar44 = vrcpps_avx(auVar48);
            auVar48 = vfnmadd213ps_fma(auVar48,auVar44,auVar39);
            auVar51 = vfmadd132ps_fma(auVar48,auVar44,auVar44);
            auVar44 = vrcpps_avx(auVar47);
            auVar47 = vfnmadd213ps_fma(auVar47,auVar44,auVar39);
            auVar52 = vfmadd132ps_fma(auVar47,auVar44,auVar44);
            auVar65 = ZEXT1664(local_1118);
            auVar5._4_4_ = uStack_10a4;
            auVar5._0_4_ = local_10a8;
            auVar5._8_4_ = uStack_10a0;
            auVar5._12_4_ = uStack_109c;
            auVar28 = vfmadd213ps_fma(auVar28,auVar5,*(undefined1 (*) [16])(uVar16 + 0xb0));
            auVar6._4_4_ = uStack_1094;
            auVar6._0_4_ = local_1098;
            auVar6._8_4_ = uStack_1090;
            auVar6._12_4_ = uStack_108c;
            auVar47 = vfmadd231ps_fma(auVar28,auVar6,local_1028);
            auVar28 = vfmadd213ps_fma(auVar34,auVar5,*(undefined1 (*) [16])(uVar16 + 0xc0));
            auVar34 = vfmadd213ps_fma(auVar24,auVar5,*(undefined1 (*) [16])(uVar16 + 0xd0));
            auVar28 = vfmadd231ps_fma(auVar28,auVar6,local_1008);
            auVar34 = vfmadd231ps_fma(auVar34,auVar6,auVar58);
            auVar7._4_4_ = uStack_1084;
            auVar7._0_4_ = local_1088;
            auVar7._8_4_ = uStack_1080;
            auVar7._12_4_ = uStack_107c;
            auVar24 = vfmadd231ps_fma(auVar47,auVar7,local_1018);
            auVar47 = vfmadd231ps_fma(auVar28,auVar7,*(undefined1 (*) [16])(uVar16 + 0x30));
            auVar48 = vfmadd231ps_fma(auVar34,auVar7,*(undefined1 (*) [16])(uVar16 + 0x40));
            auVar28 = vsubps_avx(auVar55,auVar24);
            auVar60 = ZEXT1664(local_10e8);
            auVar10._4_4_ = fStack_ff4;
            auVar10._0_4_ = local_ff8;
            auVar10._8_4_ = fStack_ff0;
            auVar10._12_4_ = fStack_fec;
            auVar34 = vsubps_avx(auVar10,auVar24);
            auVar24 = vsubps_avx(auVar57,auVar47);
            auVar62 = ZEXT1664(local_10f8);
            auVar11._4_4_ = fStack_fe4;
            auVar11._0_4_ = local_fe8;
            auVar11._8_4_ = fStack_fe0;
            auVar11._12_4_ = fStack_fdc;
            auVar47 = vsubps_avx(auVar11,auVar47);
            auVar59 = ZEXT1664(local_10d8);
            auVar44 = vsubps_avx(local_fc8,auVar48);
            auVar64 = ZEXT1664(local_1108);
            auVar12._4_4_ = fStack_fd4;
            auVar12._0_4_ = local_fd8;
            auVar12._8_4_ = fStack_fd0;
            auVar12._12_4_ = fStack_fcc;
            auVar48 = vsubps_avx(auVar12,auVar48);
            auVar45._0_4_ = auVar50._0_4_ * auVar28._0_4_;
            auVar45._4_4_ = auVar50._4_4_ * auVar28._4_4_;
            auVar45._8_4_ = auVar50._8_4_ * auVar28._8_4_;
            auVar45._12_4_ = auVar50._12_4_ * auVar28._12_4_;
            auVar40._0_4_ = auVar50._0_4_ * auVar34._0_4_;
            auVar40._4_4_ = auVar50._4_4_ * auVar34._4_4_;
            auVar40._8_4_ = auVar50._8_4_ * auVar34._8_4_;
            auVar40._12_4_ = auVar50._12_4_ * auVar34._12_4_;
            auVar49._0_4_ = auVar51._0_4_ * auVar24._0_4_;
            auVar49._4_4_ = auVar51._4_4_ * auVar24._4_4_;
            auVar49._8_4_ = auVar51._8_4_ * auVar24._8_4_;
            auVar49._12_4_ = auVar51._12_4_ * auVar24._12_4_;
            auVar53._0_4_ = auVar44._0_4_ * auVar52._0_4_;
            auVar53._4_4_ = auVar44._4_4_ * auVar52._4_4_;
            auVar53._8_4_ = auVar44._8_4_ * auVar52._8_4_;
            auVar53._12_4_ = auVar44._12_4_ * auVar52._12_4_;
            auVar43._0_4_ = auVar51._0_4_ * auVar47._0_4_;
            auVar43._4_4_ = auVar51._4_4_ * auVar47._4_4_;
            auVar43._8_4_ = auVar51._8_4_ * auVar47._8_4_;
            auVar43._12_4_ = auVar51._12_4_ * auVar47._12_4_;
            auVar31._0_4_ = auVar48._0_4_ * auVar52._0_4_;
            auVar31._4_4_ = auVar48._4_4_ * auVar52._4_4_;
            auVar31._8_4_ = auVar48._8_4_ * auVar52._8_4_;
            auVar31._12_4_ = auVar48._12_4_ * auVar52._12_4_;
            auVar28 = vpminsd_avx(auVar49,auVar43);
            auVar34 = vpminsd_avx(auVar53,auVar31);
            auVar28 = vmaxps_avx(auVar28,auVar34);
            auVar44 = vpminsd_avx(auVar45,auVar40);
            auVar47 = vpmaxsd_avx(auVar45,auVar40);
            auVar34 = vpmaxsd_avx(auVar49,auVar43);
            auVar24 = vpmaxsd_avx(auVar53,auVar31);
            auVar54 = ZEXT1664(local_10c8);
            auVar24 = vminps_avx(auVar34,auVar24);
            auVar34 = vmaxps_avx(local_1118,auVar44);
            auVar56 = ZEXT1664(local_10b8);
            local_1148 = vmaxps_avx(auVar34,auVar28);
            auVar28 = vminps_avx(auVar25._0_16_,auVar47);
            auVar28 = vminps_avx(auVar28,auVar24);
            auVar28 = vcmpps_avx(local_1148,auVar28,2);
            uVar17 = vmovmskps_avx(auVar28);
          }
          else {
            auVar27._4_4_ = fVar26;
            auVar27._0_4_ = fVar26;
            auVar27._8_4_ = fVar26;
            auVar27._12_4_ = fVar26;
            auVar28 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar16 + 0x80 + uVar20),auVar27,
                                      *(undefined1 (*) [16])(uVar16 + 0x20 + uVar20));
            auVar28 = vfmadd213ps_fma(auVar28,auVar56._0_16_,auVar54._0_16_);
            auVar34 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar16 + 0x80 + uVar23),auVar27,
                                      *(undefined1 (*) [16])(uVar16 + 0x20 + uVar23));
            auVar34 = vfmadd213ps_fma(auVar34,auVar62._0_16_,auVar59._0_16_);
            auVar24 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar16 + 0x80 + uVar22),auVar27,
                                      *(undefined1 (*) [16])(uVar16 + 0x20 + uVar22));
            auVar28 = vpmaxsd_avx(auVar28,auVar34);
            auVar34 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar16 + 0x80 + uVar21),auVar27,
                                      *(undefined1 (*) [16])(uVar16 + 0x20 + uVar21));
            auVar47 = vfmadd213ps_fma(auVar24,auVar64._0_16_,auVar60._0_16_);
            auVar24 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar16 + 0x80 + (uVar23 ^ 0x10)),
                                      auVar27,*(undefined1 (*) [16])
                                               (uVar16 + 0x20 + (uVar23 ^ 0x10)));
            auVar34 = vfmadd213ps_fma(auVar34,auVar56._0_16_,auVar54._0_16_);
            auVar24 = vfmadd213ps_fma(auVar24,auVar62._0_16_,auVar59._0_16_);
            auVar24 = vpminsd_avx(auVar34,auVar24);
            auVar34 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar16 + 0x80 + (uVar22 ^ 0x10)),
                                      auVar27,*(undefined1 (*) [16])
                                               (uVar16 + 0x20 + (uVar22 ^ 0x10)));
            auVar44 = vfmadd213ps_fma(auVar34,auVar64._0_16_,auVar60._0_16_);
            auVar34 = vpmaxsd_avx(auVar47,auVar65._0_16_);
            local_1148 = vpmaxsd_avx(auVar28,auVar34);
            auVar28 = vpminsd_avx(auVar44,auVar25._0_16_);
            auVar28 = vpminsd_avx(auVar24,auVar28);
            if (uVar17 == 6) {
              auVar34 = vcmpps_avx(local_1148,auVar28,2);
              auVar28 = vcmpps_avx(*(undefined1 (*) [16])(uVar16 + 0xe0),auVar27,2);
              auVar24 = vcmpps_avx(auVar27,*(undefined1 (*) [16])(uVar16 + 0xf0),1);
              auVar28 = vandps_avx(auVar28,auVar24);
              auVar28 = vandps_avx(auVar28,auVar34);
            }
            else {
              auVar28 = vcmpps_avx(local_1148,auVar28,2);
            }
            auVar28 = vpslld_avx(auVar28,0x1f);
            uVar17 = vmovmskps_avx(auVar28);
          }
          uVar15 = CONCAT44((int)(uVar15 >> 0x20),uVar17);
          if (uVar15 == 0) goto LAB_0191c8ec;
          lVar4 = 0;
          for (; (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
            lVar4 = lVar4 + 1;
          }
          uVar17 = uVar17 - 1 & uVar17;
          uVar18 = (ulong)uVar17;
          uVar15 = *(ulong *)(uVar16 + lVar4 * 8);
          if (uVar17 != 0) {
            uVar2 = *(uint *)(local_1148 + lVar4 * 4);
            lVar4 = 0;
            for (; (uVar18 & 1) == 0; uVar18 = uVar18 >> 1 | 0x8000000000000000) {
              lVar4 = lVar4 + 1;
            }
            uVar17 = uVar17 - 1 & uVar17;
            uVar19 = (ulong)uVar17;
            uVar18 = *(ulong *)(uVar16 + lVar4 * 8);
            uVar3 = *(uint *)(local_1148 + lVar4 * 4);
            if (uVar17 == 0) {
              if (uVar2 < uVar3) {
                *(ulong *)*pauVar14 = uVar18;
                *(uint *)(*pauVar14 + 8) = uVar3;
                pauVar14 = pauVar14 + 1;
              }
              else {
                *(ulong *)*pauVar14 = uVar15;
                *(uint *)(*pauVar14 + 8) = uVar2;
                pauVar14 = pauVar14 + 1;
                uVar15 = uVar18;
              }
            }
            else {
              auVar32._8_8_ = 0;
              auVar32._0_8_ = uVar15;
              auVar28 = vpunpcklqdq_avx(auVar32,ZEXT416(uVar2));
              auVar37._8_8_ = 0;
              auVar37._0_8_ = uVar18;
              auVar34 = vpunpcklqdq_avx(auVar37,ZEXT416(uVar3));
              lVar4 = 0;
              for (; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
                lVar4 = lVar4 + 1;
              }
              uVar17 = uVar17 - 1 & uVar17;
              uVar15 = (ulong)uVar17;
              auVar41._8_8_ = 0;
              auVar41._0_8_ = *(ulong *)(uVar16 + lVar4 * 8);
              auVar47 = vpunpcklqdq_avx(auVar41,ZEXT416(*(uint *)(local_1148 + lVar4 * 4)));
              auVar24 = vpcmpgtd_avx(auVar34,auVar28);
              if (uVar17 == 0) {
                auVar44 = vpshufd_avx(auVar24,0xaa);
                auVar24 = vblendvps_avx(auVar34,auVar28,auVar44);
                auVar28 = vblendvps_avx(auVar28,auVar34,auVar44);
                auVar34 = vpcmpgtd_avx(auVar47,auVar24);
                auVar44 = vpshufd_avx(auVar34,0xaa);
                auVar34 = vblendvps_avx(auVar47,auVar24,auVar44);
                auVar24 = vblendvps_avx(auVar24,auVar47,auVar44);
                auVar47 = vpcmpgtd_avx(auVar24,auVar28);
                auVar44 = vpshufd_avx(auVar47,0xaa);
                auVar47 = vblendvps_avx(auVar24,auVar28,auVar44);
                auVar28 = vblendvps_avx(auVar28,auVar24,auVar44);
                *pauVar14 = auVar28;
                pauVar14[1] = auVar47;
                uVar15 = auVar34._0_8_;
                pauVar14 = pauVar14 + 2;
              }
              else {
                lVar4 = 0;
                for (; (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
                  lVar4 = lVar4 + 1;
                }
                auVar46._8_8_ = 0;
                auVar46._0_8_ = *(ulong *)(uVar16 + lVar4 * 8);
                auVar48 = vpunpcklqdq_avx(auVar46,ZEXT416(*(uint *)(local_1148 + lVar4 * 4)));
                auVar44 = vpshufd_avx(auVar24,0xaa);
                auVar24 = vblendvps_avx(auVar34,auVar28,auVar44);
                auVar28 = vblendvps_avx(auVar28,auVar34,auVar44);
                auVar34 = vpcmpgtd_avx(auVar48,auVar47);
                auVar44 = vpshufd_avx(auVar34,0xaa);
                auVar34 = vblendvps_avx(auVar48,auVar47,auVar44);
                auVar47 = vblendvps_avx(auVar47,auVar48,auVar44);
                auVar44 = vpcmpgtd_avx(auVar47,auVar28);
                auVar48 = vpshufd_avx(auVar44,0xaa);
                auVar44 = vblendvps_avx(auVar47,auVar28,auVar48);
                auVar28 = vblendvps_avx(auVar28,auVar47,auVar48);
                auVar47 = vpcmpgtd_avx(auVar34,auVar24);
                auVar48 = vpshufd_avx(auVar47,0xaa);
                auVar47 = vblendvps_avx(auVar34,auVar24,auVar48);
                auVar34 = vblendvps_avx(auVar24,auVar34,auVar48);
                auVar24 = vpcmpgtd_avx(auVar44,auVar34);
                auVar48 = vpshufd_avx(auVar24,0xaa);
                auVar24 = vblendvps_avx(auVar44,auVar34,auVar48);
                auVar34 = vblendvps_avx(auVar34,auVar44,auVar48);
                *pauVar14 = auVar28;
                pauVar14[1] = auVar34;
                pauVar14[2] = auVar24;
                uVar15 = auVar47._0_8_;
                pauVar14 = pauVar14 + 3;
              }
            }
          }
        }
        (**(code **)((long)local_1128->leafIntersector +
                    (ulong)*(byte *)(uVar15 & 0xfffffffffffffff0) * 0x40))(local_fb8,ray,local_1120)
        ;
        auVar65 = ZEXT1664(local_1118);
        auVar64 = ZEXT1664(local_1108);
        auVar62 = ZEXT1664(local_10f8);
        auVar60 = ZEXT1664(local_10e8);
        auVar59 = ZEXT1664(local_10d8);
        auVar54 = ZEXT1664(local_10c8);
        auVar56 = ZEXT1664(local_10b8);
        fVar26 = (local_1130->super_RayK<1>).tfar;
        auVar25 = ZEXT1664(CONCAT412(fVar26,CONCAT48(fVar26,CONCAT44(fVar26,fVar26))));
        ray = local_1130;
        uVar20 = local_1138;
      }
LAB_0191c8ec:
    } while (pauVar14 != (undefined1 (*) [16])&local_f78);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }